

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O2

void reoProfileAplStart(reo_man *p)

{
  uint uVar1;
  reo_unit *prVar2;
  reo_plane *prVar3;
  ulong uVar4;
  ulong uVar5;
  reo_unit **pprVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  uVar1 = p->nSupp;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pprVar6 = &p->pPlanes[uVar5].pHead;
    while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
      prVar2->Weight = 0.0;
      pprVar6 = &prVar2->Next;
    }
  }
  uVar7 = 0;
  uVar5 = (ulong)(uint)p->nTops;
  if (p->nTops < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    uVar8 = (ulong)p->pTops[uVar7] & 0xfffffffffffffffe;
    *(double *)(uVar8 + 0x28) = *(double *)(uVar8 + 0x28) + 1.0;
  }
  prVar3 = p->pPlanes;
  dVar9 = 0.0;
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    prVar3[uVar5].statsCost = 0.0;
    dVar10 = 0.0;
    pprVar6 = &prVar3[uVar5].pHead;
    while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
      uVar7 = (ulong)prVar2->pE & 0xfffffffffffffffe;
      uVar8 = (ulong)prVar2->pT & 0xfffffffffffffffe;
      dVar11 = prVar2->Weight * 0.5;
      *(double *)(uVar7 + 0x28) = *(double *)(uVar7 + 0x28) + dVar11;
      *(double *)(uVar8 + 0x28) = dVar11 + *(double *)(uVar8 + 0x28);
      dVar10 = dVar10 + prVar2->Weight;
      prVar3[uVar5].statsCost = dVar10;
      pprVar6 = &prVar2->Next;
    }
    dVar9 = dVar9 + dVar10;
  }
  prVar3[(int)uVar1].statsCost = 0.0;
  p->nAplCur = dVar9;
  p->nAplBeg = dVar9;
  return;
}

Assistant:

void reoProfileAplStart( reo_man * p )
{
    reo_unit * pER, * pTR;
    reo_unit * pUnit;
    double Res, Half;
    int i;

    // clean the weights of all nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            pUnit->Weight = 0.0;
    // to assign the node weights (the probability of visiting each node)
    // we visit the node after visiting its predecessors

    // set the probability of visits to the top nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->Weight += 1.0;

    // to compute the path length (the sum of products of edge weight by edge length)
    // we visit the nodes in any order (the above order will do)
    Res = 0.0;
    for ( i = 0; i < p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = 0.0;
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            pER  = Unit_Regular(pUnit->pE);
            pTR  = Unit_Regular(pUnit->pT);
            Half = 0.5 * pUnit->Weight;
            pER->Weight += Half;
            pTR->Weight += Half;
            // add to the path length
            p->pPlanes[i].statsCost += pUnit->Weight;
        }
        Res += p->pPlanes[i].statsCost;
    }
    p->pPlanes[p->nSupp].statsCost = 0.0;
    p->nAplBeg = p->nAplCur = Res;
}